

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O3

pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool>
* __thiscall
magic_enum::containers::set<Color,_std::less<Color>_>::insert
          (pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool>
           *__return_storage_ptr__,set<Color,_std::less<Color>_> *this,value_type *value)

{
  byte bVar1;
  value_type vVar2;
  long lVar3;
  sbyte sVar4;
  bool bVar5;
  FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>
  local_38;
  
  vVar2 = *value;
  if (vVar2 == RED) {
    lVar3 = 0;
    sVar4 = 0;
  }
  else if (vVar2 == BLUE) {
    sVar4 = 2;
    lVar3 = 2;
  }
  else {
    if (vVar2 != GREEN) {
      (__return_storage_ptr__->first).parent = this;
      (__return_storage_ptr__->first).first =
           &magic_enum::detail::values_v<Color,(magic_enum::detail::enum_subtype)1>;
      (__return_storage_ptr__->first).last = &magic_enum::detail::enum_name_v<Color,(Color)1>;
      (__return_storage_ptr__->first).current = &magic_enum::detail::enum_name_v<Color,(Color)1>;
      __return_storage_ptr__->second = false;
      return __return_storage_ptr__;
    }
    sVar4 = 1;
    lVar3 = 1;
  }
  bVar1 = (this->a).a._M_elems[0];
  bVar5 = ('\x01' << sVar4 & bVar1) == 0;
  if (bVar5) {
    (this->a).a._M_elems[0] = bVar1 | '\x01' << sVar4;
    this->s = this->s + 1;
  }
  detail::
  FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>
  ::FilteredIterator(&local_38,this,
                     &magic_enum::detail::values_v<Color,(magic_enum::detail::enum_subtype)1>,
                     &magic_enum::detail::enum_name_v<Color,(Color)1>,
                     &magic_enum::detail::values_v<Color,(magic_enum::detail::enum_subtype)1> +
                     lVar3);
  *(undefined8 *)&(__return_storage_ptr__->first).field_0x20 = local_38._32_8_;
  (__return_storage_ptr__->first).last = local_38.last;
  (__return_storage_ptr__->first).current = local_38.current;
  (__return_storage_ptr__->first).parent = local_38.parent;
  (__return_storage_ptr__->first).first = local_38.first;
  __return_storage_ptr__->second = bVar5;
  return __return_storage_ptr__;
}

Assistant:

constexpr std::pair<iterator, bool> insert(const value_type& value) noexcept {
    if (auto i = index_type::at(value)) {
      typename container_type::reference ref = a[value];
      bool r = !ref;
      if (r) {
        ref = true;
        ++s;
      }

      return {iterator{this, index_type::begin(), index_type::end(), index_type::it(*i)}, r};
    }
    return {end(), false};
  }